

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::cleanup::ChunkList::AddFallback
          (ChunkList *this,void *elem,_func_void_void_ptr *destructor,SerialArena *arena)

{
  string *psVar1;
  size_t sVar2;
  Chunk *pCVar3;
  ulong uVar4;
  size_t size;
  AllocationPolicy *policy;
  SizedPtr SVar5;
  LogMessageFatal local_30 [16];
  
  psVar1 = absl::lts_20240722::log_internal::
           Check_EQImpl<google::protobuf::internal::cleanup::CleanupNode*,google::protobuf::internal::cleanup::CleanupNode*>
                     (&this->next_,&this->limit_,"next_ == limit_");
  if (psVar1 == (string *)0x0) {
    policy = (AllocationPolicy *)((arena->parent_->alloc_policy_).policy_ & 0xfffffffffffffff8);
    if (this->head_ == (Chunk *)0x0) {
      sVar2 = 0;
    }
    else {
      sVar2 = this->head_->size;
    }
    uVar4 = 0x1000;
    if (sVar2 * 2 < 0x1000) {
      uVar4 = sVar2 * 2;
    }
    size = 0x40;
    if (sVar2 != 0) {
      size = uVar4;
    }
    if (policy == (AllocationPolicy *)0x0) {
      SVar5 = AllocateAtLeast(size);
    }
    else {
      SVar5 = anon_unknown_12::AllocateMemory(policy,size);
    }
    sVar2 = SVar5.n;
    pCVar3 = (Chunk *)SVar5.p;
    (arena->space_allocated_).super___atomic_base<unsigned_long>._M_i =
         (arena->space_allocated_).super___atomic_base<unsigned_long>._M_i + sVar2;
    pCVar3->next = this->head_;
    pCVar3->size = sVar2;
    this->head_ = pCVar3;
    this->prefetch_ptr_ = (char *)(pCVar3 + 1);
    this->limit_ = (CleanupNode *)((long)&pCVar3[1].next + (sVar2 - 0x10 & 0xfffffffffffffff0));
    this->next_ = (CleanupNode *)(pCVar3 + 2);
    pCVar3[1].next = (Chunk *)elem;
    pCVar3[1].size = (size_t)destructor;
    return;
  }
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            (local_30,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/arena.cc"
             ,0x89,psVar1->_M_string_length,(psVar1->_M_dataplus)._M_p);
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_30);
}

Assistant:

void ChunkList::AddFallback(void* elem, void (*destructor)(void*),
                            SerialArena& arena) {
  ABSL_DCHECK_EQ(next_, limit_);
  SizedPtr mem = AllocateCleanupChunk(arena.parent_.AllocPolicy(),
                                      head_ == nullptr ? 0 : head_->size);
  arena.AddSpaceAllocated(mem.n);
  head_ = new (mem.p) Chunk{head_, mem.n};
  next_ = head_->First();
  prefetch_ptr_ = reinterpret_cast<char*>(next_);
  limit_ = next_ + Chunk::Capacity(mem.n);
  AddFromExisting(elem, destructor);
}